

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O3

Vec_Int_t * Abc_NtkGetLatchValues(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Int_t *p;
  int *piVar2;
  Vec_Ptr_t *pVVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  
  iVar1 = pNtk->nObjCounts[8];
  p = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar4 = iVar1;
  }
  p->nSize = 0;
  p->nCap = iVar4;
  if (iVar4 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar4 << 2);
  }
  p->pArray = piVar2;
  pVVar3 = pNtk->vBoxes;
  if (0 < pVVar3->nSize) {
    lVar6 = 0;
    do {
      if ((*(uint *)((long)pVVar3->pArray[lVar6] + 0x14) & 0xf) == 8) {
        uVar5 = *(long *)((long)pVVar3->pArray[lVar6] + 0x38) - 1;
        if (2 < uVar5) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcDar.c"
                        ,0x559,"Vec_Int_t *Abc_NtkGetLatchValues(Abc_Ntk_t *)");
        }
        Vec_IntPush(p,(int)uVar5);
      }
      lVar6 = lVar6 + 1;
      pVVar3 = pNtk->vBoxes;
    } while (lVar6 < pVVar3->nSize);
  }
  return p;
}

Assistant:

Vec_Int_t * Abc_NtkGetLatchValues( Abc_Ntk_t * pNtk )
{
    Vec_Int_t * vInits;
    Abc_Obj_t * pLatch;
    int i;
    vInits = Vec_IntAlloc( Abc_NtkLatchNum(pNtk) );
    Abc_NtkForEachLatch( pNtk, pLatch, i )
    {
        if ( Abc_LatchIsInit0(pLatch) )
            Vec_IntPush( vInits, 0 );
        else if ( Abc_LatchIsInit1(pLatch) )
            Vec_IntPush( vInits, 1 );
        else if ( Abc_LatchIsInitDc(pLatch) )
            Vec_IntPush( vInits, 2 );
        else
            assert( 0 );
    }
    return vInits;
}